

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lib.c
# Opt level: O0

GCfunc * lj_lib_pushcc(lua_State *L,lua_CFunction f,int id,int n)

{
  GCfunc *pGVar1;
  uint8_t in_DL;
  long in_RDI;
  lua_CFunction unaff_retaddr;
  GCfunc *fn;
  
  lua_pushcclosure((lua_State *)&fn->c,unaff_retaddr,(int)((ulong)in_RDI >> 0x20));
  pGVar1 = (GCfunc *)(ulong)*(uint *)(*(long *)(in_RDI + 0x18) + -8);
  (pGVar1->c).ffid = in_DL;
  (pGVar1->c).pc.ptr32 = *(int *)(in_RDI + 8) + 0x180;
  return pGVar1;
}

Assistant:

GCfunc *lj_lib_pushcc(lua_State *L, lua_CFunction f, int id, int n)
{
  GCfunc *fn;
  lua_pushcclosure(L, f, n);
  fn = funcV(L->top-1);
  fn->c.ffid = (uint8_t)id;
  setmref(fn->c.pc, &G(L)->bc_cfunc_int);
  return fn;
}